

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_add(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  numeric *this_00;
  numeric *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *this_01;
  any *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_40;
  
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::numeric>(b);
      rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
      numeric::operator+(this_00,rhs);
      cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&bStack_68);
      return (var)(proxy *)this;
    }
  }
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::__cxx11::string::typeinfo);
  if ((bVar1) && (in_RCX->mDat != (proxy *)0x0)) {
    __lhs = cs_impl::any::const_val<std::__cxx11::string>(b);
    cs_impl::any::to_string_abi_cxx11_(&local_40,in_RCX);
    std::operator+(&bStack_68,__lhs,&local_40);
    cs_impl::any::make<std::__cxx11::string,std::__cxx11::string>((any *)this,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&bStack_68,"Unsupported operator operations(Add).",(allocator *)&local_40);
  runtime_error::runtime_error(this_01,&bStack_68);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_add(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() + b.const_val<numeric>();
		else if (a.type() == typeid(string) && b.usable())
			return var::make<std::string>(a.const_val<string>() + b.to_string());
		else
			throw runtime_error("Unsupported operator operations(Add).");
	}